

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O2

void If_Dec5PerformTest(void)

{
  word wVar1;
  word t;
  
  t = 0xb0f3b0ffb0f3b0ff;
  Kit_DsdPrintFromTruth((uint *)&t,5);
  putchar(10);
  wVar1 = If_Dec5Perform(t,1);
  wVar1 = If_Dec6Truth(wVar1);
  if (t == wVar1) {
    return;
  }
  __assert_fail("t == t1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDec07.c"
                ,0x3f6,"void If_Dec5PerformTest()");
}

Assistant:

void If_Dec5PerformTest()
{
    word z, t, t1;
//    s = If_Dec5PerformEx();
//    t = If_Dec6Truth( s );
    t = ABC_CONST(0xB0F3B0FFB0F3B0FF);

    Kit_DsdPrintFromTruth( (unsigned *)&t, 5 ); printf("\n");

    z = If_Dec5Perform( t, 1 );
    t1 = If_Dec6Truth( z );
    assert( t == t1 );
}